

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O0

bool __thiscall
FTextureShader::ParseShader(FTextureShader *this,FScanner *sc,TArray<FTextureID,_FTextureID> *names)

{
  bool bVar1;
  uint uVar2;
  FShaderLayer *pFVar3;
  FShaderLayer *local_38;
  FShaderLayer *lay;
  TArray<FTextureID,_FTextureID> *pTStack_28;
  bool retval;
  TArray<FTextureID,_FTextureID> *names_local;
  FScanner *sc_local;
  FTextureShader *this_local;
  
  lay._7_1_ = 1;
  pTStack_28 = names;
  names_local = (TArray<FTextureID,_FTextureID> *)sc;
  sc_local = (FScanner *)this;
  bVar1 = FScanner::GetString(sc);
  if (bVar1) {
    FName::operator=(&this->name,(char *)names_local->Array);
    FScanner::MustGetStringName((FScanner *)names_local,"{");
    while (bVar1 = FScanner::CheckString((FScanner *)names_local,"}"), ((bVar1 ^ 0xffU) & 1) != 0) {
      if ((names_local[2].Most & 1) != 0) {
        FScanner::ScriptError((FScanner *)names_local,"Unexpected end of file encountered");
        return false;
      }
      bVar1 = FScanner::Compare((FScanner *)names_local,"layer");
      if (bVar1) {
        pFVar3 = (FShaderLayer *)operator_new(0x188);
        FShaderLayer::FShaderLayer(pFVar3);
        local_38 = pFVar3;
        bVar1 = FShaderLayer::ParseLayer(pFVar3,(FScanner *)names_local);
        pFVar3 = local_38;
        if (bVar1) {
          uVar2 = TArray<FShaderLayer_*,_FShaderLayer_*>::Size
                            (&(this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>);
          pFVar3 = local_38;
          if (uVar2 < 8) {
            TArray<FShaderLayer_*,_FShaderLayer_*>::Push
                      (&(this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>,&local_38);
          }
          else {
            if (local_38 != (FShaderLayer *)0x0) {
              FShaderLayer::~FShaderLayer(local_38);
              operator_delete(pFVar3,0x188);
            }
            FScanner::ScriptMessage((FScanner *)names_local,"Only 8 layers per texture allowed.");
          }
        }
        else {
          if (local_38 != (FShaderLayer *)0x0) {
            FShaderLayer::~FShaderLayer(local_38);
            operator_delete(pFVar3,0x188);
          }
          lay._7_1_ = 0;
        }
      }
      else {
        FScanner::ScriptError
                  ((FScanner *)names_local,"Unknown keyword \'%s\' in shader",names_local->Array);
      }
    }
  }
  return (bool)(lay._7_1_ & 1);
}

Assistant:

bool FTextureShader::ParseShader(FScanner &sc, TArray<FTextureID> &names)
{
	bool retval = true;

	if (sc.GetString())
	{
		name = sc.String;

		sc.MustGetStringName("{");
		while (!sc.CheckString("}"))
		{
			if (sc.End)
			{
				sc.ScriptError("Unexpected end of file encountered");
				return false;
			}
			else if (sc.Compare("layer"))
			{
				FShaderLayer *lay = new FShaderLayer;
				if (lay->ParseLayer(sc))
				{
					if (layers.Size() < 8)
					{
						layers.Push(lay);
					}
					else
					{
						delete lay;
						sc.ScriptMessage("Only 8 layers per texture allowed.");
					}
				}
				else
				{
					delete lay;
					retval = false;
				}
			}
			else
			{
				sc.ScriptError("Unknown keyword '%s' in shader", sc.String);
			}
		}
	}
	return retval;
}